

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::OclLib::getString(cl_kernel kernel,cl_kernel_info param_name)

{
  char *in_RDI;
  String SVar1;
  uint in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  SVar1 = getOclString<int(*)(_cl_kernel*,unsigned_int,unsigned_long,void*,unsigned_long*),_cl_kernel*,unsigned_int>
                    ((_func_int__cl_kernel_ptr_uint_unsigned_long_void_ptr_unsigned_long_ptr *)
                     kernel,(_cl_kernel *)CONCAT44(param_name,in_stack_00000010),in_stack_0000000c);
  SVar1.m_data = in_RDI;
  return SVar1;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_kernel kernel, cl_kernel_info param_name) noexcept
{
    return getOclString(OclLib::getKernelInfo, kernel, param_name);
}